

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_rfci(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *local_10;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    local_10 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_ppc64(tcg_ctx,helper_rfci_ppc64,(TCGTemp *)0x0,1,&local_10);
    ctx->exception = 0x202;
    return;
  }
  gen_exception_err(ctx,6,0x31);
  return;
}

Assistant:

static void gen_rfci(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    CHK_SV;
    /* Restore CPU state */
    gen_helper_rfci(tcg_ctx, tcg_ctx->cpu_env);
    gen_sync_exception(ctx);
}